

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepointgen.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  QString *pQVar5;
  iterator this;
  iterator iVar6;
  storage_type *in_RCX;
  int __oflag;
  int __oflag_00;
  long lVar7;
  char *pcVar8;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  char *pcVar9;
  ulong uVar10;
  QString *this_00;
  QIODevice *pQVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  QLatin1StringView other;
  QLatin1StringView other_00;
  QByteArrayView ba;
  Parser parser;
  QString local_1c0;
  QIODevice local_1a8;
  QString local_190;
  Parser local_178;
  QString local_b8;
  QArrayDataPointer<QString> local_98;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (QString *)0x0;
  local_98.size = 0;
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  local_b8.d.size = 0;
  if (argc == 1) {
    puts("Generates a tracepoint file for tracegen tool from input files.\n");
    puts("Usage: tracepointgen <output file> <input files> ");
    exit(0);
  }
  if (argc < 4) {
    puts("Generates a tracepoint file for tracegen tool from input files.\n");
    puts("Usage: tracepointgen <output file> <input files> ");
    exit(-1);
  }
  pcVar9 = argv[1];
  if (pcVar9 == (char *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar4 = -1;
    do {
      lVar7 = lVar4 + 1;
      lVar1 = lVar4 + 1;
      lVar4 = lVar7;
    } while (pcVar9[lVar1] != '\0');
  }
  other.m_size = lVar7;
  other.m_data = pcVar9;
  QString::operator=(&local_78,other);
  pcVar9 = argv[2];
  if (pcVar9 == (char *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar4 = -1;
    do {
      lVar7 = lVar4 + 1;
      lVar1 = lVar4 + 1;
      lVar4 = lVar7;
    } while (pcVar9[lVar1] != '\0');
  }
  other_00.m_size = lVar7;
  other_00.m_data = pcVar9;
  QString::operator=(&local_b8,other_00);
  uVar12 = 4;
  if (4 < argc) {
    uVar12 = (ulong)(uint)argc;
  }
  uVar10 = 3;
  do {
    pcVar9 = argv[uVar10];
    if (pcVar9 == (char *)0x0) {
      this_00 = (QString *)0x0;
    }
    else {
      pQVar5 = (QString *)0xffffffffffffffff;
      do {
        this_00 = (QString *)((long)&(pQVar5->d).d + 1);
        pcVar8 = pcVar9 + 1 + (long)pQVar5;
        pQVar5 = this_00;
      } while (*pcVar8 != '\0');
    }
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)pcVar9;
    QString::fromLatin1((QString *)&local_178,this_00,ba);
    local_58.d = (Data *)local_178.m_functions.d.d;
    local_58.ptr = &(local_178.m_functions.d.ptr)->className;
    local_58.size = local_178.m_functions.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_98,local_98.size,(QString *)&local_58);
    QList<QString>::end((QList<QString> *)&local_98);
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
      }
    }
    uVar10 = uVar10 + 1;
  } while (uVar10 != uVar12);
  memset(&local_178,0xaa,0xc0);
  memset(&local_178,0,0xa8);
  local_178.m_provider.d.d = local_78.d.d;
  local_178.m_provider.d.ptr = local_78.d.ptr;
  local_178.m_provider.d.size = local_78.d.size;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this = QList<QString>::begin((QList<QString> *)&local_98);
  iVar6 = QList<QString>::end((QList<QString> *)&local_98);
  if (this.i != iVar6.i) {
    do {
      bVar2 = QString::startsWith(this.i,(QChar)0x49,CaseSensitive);
      if (bVar2) {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        QString::right(&local_190,this.i,((this.i)->d).size + -1);
        in_RCX = (storage_type *)0x0;
        QString::split((QStringList *)&local_58,&local_190,(QChar)0x3b,(SplitBehavior)0x0,
                       CaseSensitive);
        if (&(local_190.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_190.d.d)->super_QArrayData,2,0x10);
          }
        }
        QtPrivate::QCommonArrayOps<QString>::growAppend
                  ((QCommonArrayOps<QString> *)&local_178.m_includeDirs,local_58.ptr,
                   (QString *)(&(local_58.ptr)->d + local_58.size));
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
      }
      else {
        local_1a8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
        local_1a8.d_ptr._M_t.
        super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
        super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
        super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
             (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
             &DAT_aaaaaaaaaaaaaaaa;
        QFile::QFile((QFile *)&local_1a8,this.i);
        iVar3 = QFile::open((QFile *)&local_1a8,(char *)0x11,__oflag);
        if ((char)iVar3 == '\0') {
          QString::toLocal8Bit_helper
                    ((QByteArray *)&local_58,(QChar *)((this.i)->d).ptr,((this.i)->d).size);
          pcVar9 = (char *)local_58.ptr;
          if ((Function *)local_58.ptr == (Function *)0x0) {
            pcVar9 = "";
          }
          QIODevice::errorString(&local_1c0,&local_1a8);
          QString::toLocal8Bit_helper
                    ((QByteArray *)&local_190,(QChar *)local_1c0.d.ptr,local_1c0.d.size);
          pcVar8 = (char *)local_190.d.ptr;
          if (local_190.d.ptr == (char16_t *)0x0) {
            pcVar8 = "";
          }
          panic("Cannot open \'%s\' for reading: %s\n",pcVar9,pcVar8);
          if (&(local_190.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_190.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_1c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_58.d)->super_QArrayData,1,0x10);
            }
          }
        }
        Parser::parse(&local_178,&local_1a8,this.i);
        QFile::~QFile((QFile *)&local_1a8);
      }
      this.i = this.i + 1;
    } while (this.i != iVar6.i);
  }
  if (((undefined1 *)local_178.m_functions.d.size == (undefined1 *)0x0) &&
     (local_178.m_points.d.size == 0)) {
    QString::toLocal8Bit_helper((QByteArray *)&local_58,(QChar *)local_78.d.ptr,local_78.d.size);
    pcVar9 = (char *)local_58.ptr;
    if ((Function *)local_58.ptr == (Function *)0x0) {
      pcVar9 = "";
    }
    panic("empty provider %s\n",pcVar9);
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,1,0x10);
      }
    }
  }
  local_1a8._vptr_QIODevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_1a8.d_ptr._M_t.
  super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
  super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
  super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl =
       (__uniq_ptr_data<QIODevicePrivate,_std::default_delete<QIODevicePrivate>,_true,_true>)
       &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_1a8,&local_b8);
  iVar3 = QFile::open((QFile *)&local_1a8,(char *)0xa,__oflag_00);
  __buf = extraout_RDX;
  if ((char)iVar3 == '\0') {
    QString::toLocal8Bit_helper((QByteArray *)&local_58,(QChar *)local_b8.d.ptr,local_b8.d.size);
    pcVar9 = (char *)local_58.ptr;
    if ((Function *)local_58.ptr == (Function *)0x0) {
      pcVar9 = "";
    }
    QIODevice::errorString(&local_1c0,&local_1a8);
    QString::toLocal8Bit_helper((QByteArray *)&local_190,(QChar *)local_1c0.d.ptr,local_1c0.d.size);
    if (local_190.d.ptr == (char16_t *)0x0) {
      local_190.d.ptr = L"";
    }
    panic("Cannot open \'%s\' for writing: %s\n",pcVar9,local_190.d.ptr);
    __buf = extraout_RDX_00;
    if (&(local_190.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_190.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_190.d.d)->super_QArrayData,1,0x10);
        __buf = extraout_RDX_01;
      }
    }
    if (&(local_1c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1c0.d.d)->super_QArrayData,2,0x10);
        __buf = extraout_RDX_02;
      }
    }
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,1,0x10);
        __buf = extraout_RDX_03;
      }
    }
  }
  pQVar11 = &local_1a8;
  Parser::write(&local_178,(int)&local_1a8,__buf,(size_t)in_RCX);
  QFileDevice::close((QFileDevice *)&local_1a8,(int)pQVar11);
  QFile::~QFile((QFile *)&local_1a8);
  Parser::~Parser(&local_178);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    QString provider;
    QList<QString> inputFiles;
    QString outFile;

    parseArgs(argc, argv, provider, outFile, inputFiles);

    Parser parser(provider);

    for (const QString &inputFile : inputFiles) {
        if (inputFile.startsWith(QLatin1Char('I'))) {
            QStringList includeDirs = inputFile.right(inputFile.length() - 1).split(QLatin1Char(';'));
            parser.addIncludeDirs(includeDirs);
            continue;
        }
        QFile in(inputFile);
        if (!in.open(QIODevice::ReadOnly | QIODevice::Text)) {
            panic("Cannot open '%s' for reading: %s\n",
                    qPrintable(inputFile), qPrintable(in.errorString()));
        }
        DEBUGPRINTF(printf("tracepointgen: parse %s\n", qPrintable(inputFile)));
        parser.parse(in, inputFile);
    }
    if (parser.isEmpty())
        panic("empty provider %s\n", qPrintable(provider));

    QFile out(outFile);

    if (!out.open(QIODevice::WriteOnly | QIODevice::Truncate)) {
        panic("Cannot open '%s' for writing: %s\n",
                qPrintable(outFile), qPrintable(out.errorString()));
    }

    parser.write(out);
    out.close();

    return 0;
}